

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.cc
# Opt level: O0

bool __thiscall libwebm::VpxPes2Ts::ConvertToFile(VpxPes2Ts *this)

{
  bool bVar1;
  char *__filename;
  FILE *pFVar2;
  undefined8 uVar3;
  Webm2Pes *this_00;
  pointer this_01;
  FILEDeleter local_21;
  unique_ptr<_IO_FILE,_libwebm::FILEDeleter> local_20;
  VpxPes2Ts *local_18;
  VpxPes2Ts *this_local;
  
  local_18 = this;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(__filename,"wb");
  std::unique_ptr<_IO_FILE,libwebm::FILEDeleter>::unique_ptr<libwebm::FILEDeleter,void>
            ((unique_ptr<_IO_FILE,libwebm::FILEDeleter> *)&local_20,(pointer)pFVar2,&local_21);
  std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::operator=(&this->output_file_,&local_20);
  std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::~unique_ptr(&local_20);
  bVar1 = std::operator==(&this->output_file_,(nullptr_t)0x0);
  pFVar2 = _stderr;
  if (bVar1) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"VpxPes2Ts: Cannot open %s for output.\n",uVar3);
    this_local._7_1_ = false;
  }
  else {
    this_00 = (Webm2Pes *)operator_new(0xa8);
    Webm2Pes::Webm2Pes(this_00,&this->input_file_name_,&this->super_PacketReceiverInterface);
    std::unique_ptr<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>::reset
              (&this->pes_converter_,this_00);
    bVar1 = std::operator==(&this->pes_converter_,(nullptr_t)0x0);
    if (bVar1) {
      fprintf(_stderr,"VpxPes2Ts: Out of memory.\n");
      this_local._7_1_ = false;
    }
    else {
      this_01 = std::unique_ptr<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>::
                operator->(&this->pes_converter_);
      this_local._7_1_ = Webm2Pes::ConvertToPacketReceiver(this_01);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VpxPes2Ts::ConvertToFile() {
  output_file_ = FilePtr(fopen(output_file_name_.c_str(), "wb"), FILEDeleter());
  if (output_file_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Cannot open %s for output.\n",
                 output_file_name_.c_str());
    return false;
  }
  pes_converter_.reset(new Webm2Pes(input_file_name_, this));
  if (pes_converter_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Out of memory.\n");
    return false;
  }
  return pes_converter_->ConvertToPacketReceiver();
}